

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

void __thiscall Minisat::SimpSolver::~SimpSolver(SimpSolver *this)

{
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SimpSolver_0011bd38;
  vec<char,_int>::~vec((vec<char,_int> *)&this->eliminated);
  vec<int,_int>::~vec(&this->frozen_vars);
  vec<char,_int>::~vec((vec<char,_int> *)&this->frozen);
  vec<unsigned_int,_int>::~vec(&(this->subsumption_queue).buf);
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::~Heap(&this->elim_heap);
  vec<int,_int>::~vec((vec<int,_int> *)&this->n_occ);
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  ::~OccLists(&this->occurs);
  vec<char,_int>::~vec((vec<char,_int> *)&this->touched);
  vec<unsigned_int,_int>::~vec(&this->elimclauses);
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

SimpSolver::~SimpSolver()
{
}